

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O3

bool wallet::IsSQLiteFile(path *path)

{
  long lVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  CChainParams *pCVar6;
  long in_FS_OFFSET;
  bool bVar7;
  string_view source_file;
  string_view logging_function;
  error_code ec;
  size_type __dnew_1;
  char app_id [4];
  size_type __dnew;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  char magic [16];
  ifstream file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [31];
  string magic_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = std::filesystem::status((path *)path);
  bVar7 = false;
  if ((cVar3 != '\0') && (bVar7 = false, cVar3 != -1)) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    uVar5 = std::filesystem::file_size((path *)path,&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      pcVar2 = (path->super_path)._M_pathname._M_dataplus._M_p;
      magic_str._M_dataplus._M_p = (pointer)&magic_str.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&magic_str,pcVar2,
                 pcVar2 + (path->super_path)._M_pathname._M_string_length);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/db.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "IsSQLiteFile";
      logging_function._M_len = 0xc;
      LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x7f,ALL,Info,(ConstevalFormatString<3U>)0x10d0ddb,
                 (char (*) [13])"IsSQLiteFile",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &magic_str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)magic_str._M_dataplus._M_p != &magic_str.field_2) {
        operator_delete(magic_str._M_dataplus._M_p,magic_str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_file != local_250) {
        operator_delete(_file,local_250[0]._M_allocated_capacity + 1);
      }
    }
    if (uVar5 < 0x200) {
      bVar7 = false;
    }
    else {
      std::ifstream::ifstream(&file,(path->super_path)._M_pathname._M_dataplus._M_p,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        bVar7 = false;
      }
      else {
        std::istream::read((char *)&file,(long)magic);
        std::istream::seekg((long)&file,0x44);
        std::istream::read((char *)&file,(long)app_id);
        std::ifstream::close();
        __dnew = 0x10;
        magic_str._M_dataplus._M_p = (pointer)&magic_str.field_2;
        magic_str._M_dataplus._M_p =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_create(&magic_str,&__dnew,0);
        magic_str.field_2._M_allocated_capacity = __dnew;
        *(undefined8 *)magic_str._M_dataplus._M_p = magic._0_8_;
        *(undefined8 *)(magic_str._M_dataplus._M_p + 8) = magic._8_8_;
        magic_str._M_string_length = __dnew;
        magic_str._M_dataplus._M_p[__dnew] = '\0';
        __dnew_1 = 0x10;
        __dnew = (size_type)&local_288;
        __s2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__dnew,&__dnew_1,0);
        local_288._M_allocated_capacity = __dnew_1;
        __s2->_M_allocated_capacity = 0x66206574694c5153;
        *(char *)((long)__s2 + 8) = 'o';
        *(char *)((long)__s2 + 9) = 'r';
        *(char *)((long)__s2 + 10) = 'm';
        *(char *)((long)__s2 + 0xb) = 'a';
        *(char *)((long)__s2 + 0xc) = 't';
        *(char *)((long)__s2 + 0xd) = ' ';
        *(char *)((long)__s2 + 0xe) = '3';
        *(char *)((long)__s2 + 0xf) = '\0';
        local_290 = __dnew_1;
        __s2->_M_local_buf[__dnew_1] = '\0';
        __dnew = (size_type)__s2;
        if (magic_str._M_string_length == __dnew_1) {
          if (magic_str._M_string_length == 0) {
            bVar7 = true;
          }
          else {
            iVar4 = bcmp(magic_str._M_dataplus._M_p,__s2,magic_str._M_string_length);
            bVar7 = iVar4 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (__s2 != &local_288) {
          operator_delete(__s2,local_288._M_allocated_capacity + 1);
        }
        if (bVar7) {
          pCVar6 = Params();
          bVar7 = *(char (*) [4])(pCVar6->pchMessageStart)._M_elems == app_id;
        }
        else {
          bVar7 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)magic_str._M_dataplus._M_p != &magic_str.field_2) {
          operator_delete(magic_str._M_dataplus._M_p,magic_str.field_2._M_allocated_capacity + 1);
        }
      }
      std::ifstream::~ifstream(&file);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSQLiteFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A SQLite Database file is at least 512 bytes.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 512) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    // Magic is at beginning and is 16 bytes long
    char magic[16];
    file.read(magic, 16);

    // Application id is at offset 68 and 4 bytes long
    file.seekg(68, std::ios::beg);
    char app_id[4];
    file.read(app_id, 4);

    file.close();

    // Check the magic, see https://sqlite.org/fileformat.html
    std::string magic_str(magic, 16);
    if (magic_str != std::string{"SQLite format 3\000", 16}) {
        return false;
    }

    // Check the application id matches our network magic
    return memcmp(Params().MessageStart().data(), app_id, 4) == 0;
}